

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::InvalidateSubFboUnbindReadCase::render
          (InvalidateSubFboUnbindReadCase *this,Surface *dst)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int height;
  DataType DVar5;
  deUint32 program;
  int iVar6;
  int iVar7;
  Context *pCVar8;
  TransferFormat TVar9;
  size_type sVar10;
  reference attachments_00;
  DataTypes *pDVar11;
  ContextWrapper *pCVar12;
  bool local_66a;
  bool local_669;
  Vector<float,_3> local_65c;
  Vector<float,_3> local_650;
  deUint32 local_644;
  deUint32 texShaderID_1;
  Vector<float,_4> local_630;
  float local_620 [2];
  DataTypes local_618;
  undefined1 local_5f8 [8];
  Texture2DShader texShader_1;
  Vector<float,_3> local_450;
  deUint32 local_444;
  deUint32 texShaderID;
  Vector<float,_4> local_430;
  TextureFormat local_420;
  DataTypes local_418;
  undefined1 local_3f8 [8];
  Texture2DShader texShader;
  Vector<float,_3> local_254;
  Vector<float,_4> local_248;
  float local_238 [2];
  TransferFormat local_230;
  TransferFormat transferFmt_1;
  deUint32 local_220;
  deUint32 dStack_21c;
  TransferFormat transferFmt;
  deUint32 gradShaderID;
  undefined1 local_208 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  GradientShader gradShader;
  int readH;
  int readW;
  int readY;
  int readX;
  int invalidateH;
  int invalidateW;
  int invalidateY;
  int invalidateX;
  deUint32 depthStencilTex;
  deUint32 colorTex;
  deUint32 fbo;
  bool stencil;
  bool depth;
  TextureFormatInfo colorFmtInfo;
  TextureFormat depthStencilFmt;
  TextureFormat colorFmt;
  Surface *dst_local;
  InvalidateSubFboUnbindReadCase *this_local;
  
  depthStencilFmt = glu::mapGLInternalFormat(this->m_colorFmt);
  if (this->m_depthStencilFmt == 0) {
    tcu::TextureFormat::TextureFormat((TextureFormat *)(colorFmtInfo.lookupBias.m_data + 2));
  }
  else {
    colorFmtInfo.lookupBias.m_data._8_8_ = glu::mapGLInternalFormat(this->m_depthStencilFmt);
  }
  tcu::getTextureFormatInfo((TextureFormatInfo *)&fbo,&depthStencilFmt);
  local_669 = colorFmtInfo.lookupBias.m_data[2] == 2.52234e-44 ||
              colorFmtInfo.lookupBias.m_data[2] == 2.8026e-44;
  colorTex._3_1_ = local_669;
  local_66a = colorFmtInfo.lookupBias.m_data[2] == 2.66247e-44 ||
              colorFmtInfo.lookupBias.m_data[2] == 2.8026e-44;
  colorTex._2_1_ = local_66a;
  depthStencilTex = 0;
  invalidateX = 0;
  invalidateY = 0;
  pCVar12 = &(this->super_FboTestCase).super_ContextWrapper;
  iVar2 = sglr::ContextWrapper::getWidth(pCVar12);
  iVar3 = sglr::ContextWrapper::getHeight(pCVar12);
  iVar4 = sglr::ContextWrapper::getWidth(pCVar12);
  height = sglr::ContextWrapper::getHeight(pCVar12);
  DVar5 = FboTestUtil::getFragmentOutputType(&depthStencilFmt);
  FboTestUtil::GradientShader::GradientShader
            ((GradientShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,DVar5);
  getFBODiscardAttachments
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208,
             this->m_invalidateBuffers);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  program = (*pCVar8->_vptr_Context[0x75])
                      (pCVar8,&attachments.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  transferFmt_1.format = depthStencilFmt.order;
  transferFmt_1.dataType = depthStencilFmt.type;
  TVar9 = glu::getTransferFormat(depthStencilFmt);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_FboTestCase).super_ContextWrapper,1,(deUint32 *)&invalidateX);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,invalidateX);
  pCVar12 = &(this->super_FboTestCase).super_ContextWrapper;
  dVar1 = this->m_colorFmt;
  iVar6 = sglr::ContextWrapper::getWidth(pCVar12);
  iVar7 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  local_220 = TVar9.format;
  dStack_21c = TVar9.dataType;
  sglr::ContextWrapper::glTexImage2D
            (pCVar12,0xde1,0,dVar1,iVar6,iVar7,0,local_220,dStack_21c,(void *)0x0);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2801,0x2600);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2800,0x2600);
  if (this->m_depthStencilFmt != 0) {
    local_238[0] = colorFmtInfo.lookupBias.m_data[2];
    local_238[1] = colorFmtInfo.lookupBias.m_data[3];
    local_230 = glu::getTransferFormat((TextureFormat)colorFmtInfo.lookupBias.m_data._8_8_);
    sglr::ContextWrapper::glGenTextures
              (&(this->super_FboTestCase).super_ContextWrapper,1,(deUint32 *)&invalidateY);
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboTestCase).super_ContextWrapper,0xde1,invalidateY);
    pCVar12 = &(this->super_FboTestCase).super_ContextWrapper;
    dVar1 = this->m_depthStencilFmt;
    iVar6 = sglr::ContextWrapper::getWidth(pCVar12);
    iVar7 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
    sglr::ContextWrapper::glTexImage2D
              (pCVar12,0xde1,0,dVar1,iVar6,iVar7,0,local_230.format,local_230.dataType,(void *)0x0);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2801,0x2600);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2800,0x2600);
  }
  sglr::ContextWrapper::glGenFramebuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,&depthStencilTex);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,depthStencilTex);
  sglr::ContextWrapper::glFramebufferTexture2D
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8ce0,0xde1,invalidateX,0);
  if ((colorTex._3_1_ & 1) != 0) {
    sglr::ContextWrapper::glFramebufferTexture2D
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d00,0xde1,invalidateY,0);
  }
  if ((colorTex._2_1_ & 1) != 0) {
    sglr::ContextWrapper::glFramebufferTexture2D
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d20,0xde1,invalidateY,0);
  }
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  tcu::Vector<float,_4>::Vector(&local_248,0.0,0.0,0.0,1.0);
  FboTestCase::clearColorBuffer(&this->super_FboTestCase,&depthStencilFmt,&local_248);
  sglr::ContextWrapper::glClear(&(this->super_FboTestCase).super_ContextWrapper,0x500);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glStencilOp
            (&(this->super_FboTestCase).super_ContextWrapper,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207,1,0xff);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestUtil::GradientShader::setGradient
            ((GradientShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pCVar8,program,(Vec4 *)&fbo,
             (Vec4 *)(colorFmtInfo.valueMin.m_data + 2));
  pCVar8 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  tcu::Vector<float,_3>::Vector(&local_254,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&texShader.m_outputType,1.0,1.0,1.0);
  sglr::drawQuad(pCVar8,program,&local_254,(Vec3 *)&texShader.m_outputType);
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208);
  attachments_00 =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208,0);
  sglr::ContextWrapper::glInvalidateSubFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,(int)sVar10,attachments_00,0,0,
             iVar2 / 2,iVar3);
  sglr::ContextWrapper::glBindFramebuffer(&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0);
  sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glClearColor
            (&(this->super_FboTestCase).super_ContextWrapper,0.25,0.5,0.75,1.0);
  sglr::ContextWrapper::glClear(&(this->super_FboTestCase).super_ContextWrapper,0x4500);
  sglr::ContextWrapper::glScissor
            (&(this->super_FboTestCase).super_ContextWrapper,iVar2 / 2,0,iVar4 / 2,height);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xc11);
  if ((this->m_invalidateBuffers & 0x4000) == 0) {
    local_618.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_618.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_618.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FboTestUtil::DataTypes::DataTypes(&local_618);
    local_620[0] = colorFmtInfo.lookupBias.m_data[2];
    local_620[1] = colorFmtInfo.lookupBias.m_data[3];
    DVar5 = glu::getSampler2DType((TextureFormat)colorFmtInfo.lookupBias.m_data._8_8_);
    pDVar11 = FboTestUtil::DataTypes::operator<<(&local_618,DVar5);
    tcu::Vector<float,_4>::Vector(&local_630,1.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffff9c0,0.0);
    FboTestUtil::Texture2DShader::Texture2DShader
              ((Texture2DShader *)local_5f8,pDVar11,TYPE_FLOAT_VEC4,&local_630,
               (Vec4 *)&stack0xfffffffffffff9c0);
    FboTestUtil::DataTypes::~DataTypes(&local_618);
    pCVar8 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    local_644 = (*pCVar8->_vptr_Context[0x75])(pCVar8,local_5f8);
    pCVar8 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_5f8,pCVar8,local_644);
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboTestCase).super_ContextWrapper,0xde1,invalidateY);
    pCVar8 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar1 = local_644;
    tcu::Vector<float,_3>::Vector(&local_650,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_65c,1.0,1.0,0.0);
    sglr::drawQuad(pCVar8,dVar1,&local_650,&local_65c);
    FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_5f8);
  }
  else {
    local_418.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_418.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_418.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FboTestUtil::DataTypes::DataTypes(&local_418);
    local_420 = depthStencilFmt;
    DVar5 = glu::getSampler2DType(depthStencilFmt);
    pDVar11 = FboTestUtil::DataTypes::operator<<(&local_418,DVar5);
    tcu::Vector<float,_4>::Vector(&local_430,1.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffffbc0,0.0);
    FboTestUtil::Texture2DShader::Texture2DShader
              ((Texture2DShader *)local_3f8,pDVar11,TYPE_FLOAT_VEC4,&local_430,
               (Vec4 *)&stack0xfffffffffffffbc0);
    FboTestUtil::DataTypes::~DataTypes(&local_418);
    pCVar8 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    local_444 = (*pCVar8->_vptr_Context[0x75])();
    FboTestUtil::Texture2DShader::setTexScaleBias
              ((Texture2DShader *)local_3f8,0,(Vec4 *)(colorFmtInfo.valueMax.m_data + 2),
               (Vec4 *)(colorFmtInfo.lookupScale.m_data + 2));
    pCVar8 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_3f8,pCVar8,local_444);
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboTestCase).super_ContextWrapper,0xde1,invalidateX);
    pCVar8 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar1 = local_444;
    tcu::Vector<float,_3>::Vector(&local_450,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&texShader_1.field_0x194,1.0,1.0,0.0);
    sglr::drawQuad(pCVar8,dVar1,&local_450,(Vec3 *)&texShader_1.field_0x194);
    FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_3f8);
  }
  iVar2 = sglr::ContextWrapper::getWidth(&(this->super_FboTestCase).super_ContextWrapper);
  iVar3 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestCase::readPixels(&this->super_FboTestCase,dst,0,0,iVar2,iVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208);
  FboTestUtil::GradientShader::~GradientShader
            ((GradientShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		colorFmt				= glu::mapGLInternalFormat(m_colorFmt);
		tcu::TextureFormat		depthStencilFmt			= m_depthStencilFmt != GL_NONE ? glu::mapGLInternalFormat(m_depthStencilFmt) : tcu::TextureFormat();
		tcu::TextureFormatInfo	colorFmtInfo			= tcu::getTextureFormatInfo(colorFmt);
		bool					depth					= depthStencilFmt.order == tcu::TextureFormat::D || depthStencilFmt.order == tcu::TextureFormat::DS;
		bool					stencil					= depthStencilFmt.order == tcu::TextureFormat::S || depthStencilFmt.order == tcu::TextureFormat::DS;
		deUint32				fbo						= 0;
		deUint32				colorTex				= 0;
		deUint32				depthStencilTex			= 0;
		int						invalidateX				= 0;
		int						invalidateY				= 0;
		int						invalidateW				= getWidth()/2;
		int						invalidateH				= getHeight();
		int						readX					= invalidateW;
		int						readY					= 0;
		int						readW					= getWidth()/2;
		int						readH					= getHeight();
		GradientShader			gradShader				(getFragmentOutputType(colorFmt));
		vector<deUint32>		attachments				= getFBODiscardAttachments(m_invalidateBuffers);
		deUint32				gradShaderID			= getCurrentContext()->createProgram(&gradShader);

		// Create fbo.
		{
			glu::TransferFormat transferFmt = glu::getTransferFormat(colorFmt);

			glGenTextures	(1, &colorTex);
			glBindTexture	(GL_TEXTURE_2D, colorTex);
			glTexImage2D	(GL_TEXTURE_2D, 0, m_colorFmt, getWidth(), getHeight(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);
			glTexParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		}

		if (m_depthStencilFmt != GL_NONE)
		{
			glu::TransferFormat transferFmt = glu::getTransferFormat(depthStencilFmt);

			glGenTextures	(1, &depthStencilTex);
			glBindTexture	(GL_TEXTURE_2D, depthStencilTex);
			glTexImage2D	(GL_TEXTURE_2D, 0, m_depthStencilFmt, getWidth(), getHeight(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);
			glTexParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		}

		glGenFramebuffers		(1, &fbo);
		glBindFramebuffer		(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture2D	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, colorTex, 0);

		if (depth)
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, depthStencilTex, 0);

		if (stencil)
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, depthStencilTex, 0);

		checkFramebufferStatus		(GL_FRAMEBUFFER);

		clearColorBuffer(colorFmt, tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
		glClear			(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		gradShader.setGradient(*getCurrentContext(), gradShaderID, colorFmtInfo.valueMin, colorFmtInfo.valueMax);
		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateSubFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), &attachments[0], invalidateX, invalidateY, invalidateW, invalidateH);

		glBindFramebuffer	(GL_FRAMEBUFFER, 0);
		glDisable			(GL_DEPTH_TEST);
		glDisable			(GL_STENCIL_TEST);

		glClearColor		(0.25f, 0.5f, 0.75f, 1.0f);
		glClear				(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		// Limit read area using scissor.
		glScissor			(readX, readY, readW, readH);
		glEnable			(GL_SCISSOR_TEST);

		if ((m_invalidateBuffers & GL_COLOR_BUFFER_BIT) != 0)
		{
			// Render color.
			Texture2DShader texShader(DataTypes() << glu::getSampler2DType(colorFmt), glu::TYPE_FLOAT_VEC4);
			deUint32		texShaderID = getCurrentContext()->createProgram(&texShader);

			texShader.setTexScaleBias(0, colorFmtInfo.lookupScale, colorFmtInfo.lookupBias);
			texShader.setUniforms(*getCurrentContext(), texShaderID);

			glBindTexture(GL_TEXTURE_2D, colorTex);
			sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}
		else
		{
			// Render depth.
			Texture2DShader texShader(DataTypes() << glu::getSampler2DType(depthStencilFmt), glu::TYPE_FLOAT_VEC4);
			deUint32		texShaderID = getCurrentContext()->createProgram(&texShader);

			texShader.setUniforms(*getCurrentContext(), texShaderID);

			glBindTexture(GL_TEXTURE_2D, depthStencilTex);
			sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}